

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
ExemptionSearchIRCCommand::trigger
          (ExemptionSearchIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  byte bVar2;
  long *plVar3;
  tm *__tp;
  char *pcVar4;
  uint __args;
  size_t sVar5;
  long lVar6;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  basic_string_view<char,_std::char_traits<char>_> rhs_03;
  Entry *entry;
  char *local_230;
  IRC_Bot *local_228;
  size_t local_220;
  string types;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  function<bool_(unsigned_int)> isMatch;
  time_t current_time;
  string out;
  string_view params;
  string ip_str;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  char timeStr [256];
  
  pcVar4 = nick._M_str;
  sVar5 = nick._M_len;
  plVar3 = (long *)RenX::ExemptionDatabase::getEntries();
  if (parameters._M_len == 0) {
    string_printf_abi_cxx11_
              ((string *)timeStr,"There are a total of %u entries in the exemption database.",
               plVar3[1] - *plVar3 >> 3);
    Jupiter::IRC::Client::sendNotice(source,sVar5,pcVar4,timeStr._8_8_,timeStr._0_8_);
    std::__cxx11::string::~string((string *)timeStr);
  }
  else {
    if (plVar3[1] == *plVar3) {
      Jupiter::IRC::Client::sendNotice(source,sVar5,pcVar4,0x20,"The exemption database is empty!");
      return;
    }
    timeStr[0] = (undefined1)parameters._M_len;
    timeStr[1] = parameters._M_len._1_1_;
    timeStr[2] = parameters._M_len._2_1_;
    timeStr[3] = parameters._M_len._3_1_;
    timeStr[4] = parameters._M_len._4_1_;
    timeStr[5] = parameters._M_len._5_1_;
    timeStr[6] = parameters._M_len._6_1_;
    timeStr[7] = parameters._M_len._7_1_;
    timeStr._8_8_ = parameters._M_str;
    isMatch.super__Function_base._M_functor._M_unused._M_member_pointer = 2;
    isMatch.super__Function_base._M_functor._8_8_ = anon_var_dwarf_ef54;
    local_228 = source;
    local_220 = sVar5;
    jessilib::
    word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
              (&command_split,(basic_string_view<char,_std::char_traits<char>_> *)timeStr,
               (basic_string_view<char,_std::char_traits<char>_> *)&isMatch);
    params._M_len = command_split.second._M_len;
    params._M_str = command_split.second._M_str;
    isMatch.super__Function_base._M_manager = (_Manager_type)0x0;
    isMatch._M_invoker = (_Invoker_type)0x0;
    isMatch.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    isMatch.super__Function_base._M_functor._8_8_ = 0;
    isMatch.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
    *(function<bool_(unsigned_int)> **)isMatch.super__Function_base._M_functor._M_unused._0_8_ =
         &isMatch;
    *(Entry ***)((long)isMatch.super__Function_base._M_functor._M_unused._0_8_ + 8) = &entry;
    *(string_view **)((long)isMatch.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &params;
    isMatch._M_invoker =
         std::
         _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Commands/RenX_Commands.cpp:2481:48)>
         ::_M_invoke;
    isMatch.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Commands/RenX_Commands.cpp:2481:48)>
         ::_M_manager;
    rhs._M_str = "all";
    rhs._M_len = 3;
    bVar1 = jessilib::equalsi<char,char>(command_split.first,rhs);
    __args = 1;
    if ((!bVar1) &&
       (__y._M_str = "*", __y._M_len = 1, bVar1 = std::operator==(command_split.first,__y), !bVar1))
    {
      rhs_00._M_str = "ip";
      rhs_00._M_len = 2;
      bVar1 = jessilib::equalsi<char,char>(command_split.first,rhs_00);
      if (bVar1) {
        __args = 2;
      }
      else {
        rhs_01._M_str = "steam";
        rhs_01._M_len = 5;
        bVar1 = jessilib::equalsi<char,char>(command_split.first,rhs_01);
        if (bVar1) {
          __args = 3;
        }
        else {
          rhs_02._M_str = "setter";
          rhs_02._M_len = 6;
          bVar1 = jessilib::equalsi<char,char>(command_split.first,rhs_02);
          if (bVar1) {
            __args = 4;
          }
          else {
            rhs_03._M_str = "active";
            rhs_03._M_len = 6;
            bVar1 = jessilib::equalsi<char,char>(command_split.first,rhs_03);
            if (bVar1) {
              __args = 5;
            }
            else {
              params._M_len = parameters._M_len;
              params._M_str = parameters._M_str;
              __args = 0;
            }
          }
        }
      }
    }
    out._M_dataplus._M_p = (pointer)&out.field_2;
    out._M_string_length = 0;
    types._M_dataplus._M_p = (pointer)&types.field_2;
    types._M_string_length = 0;
    out.field_2._M_local_buf[0] = '\0';
    types.field_2._M_local_buf[0] = '\0';
    local_230 = pcVar4;
    for (lVar6 = 0; lVar6 != plVar3[1] - *plVar3 >> 3; lVar6 = lVar6 + 1) {
      entry = *(Entry **)(*plVar3 + lVar6 * 8);
      bVar1 = std::function<bool_(unsigned_int)>::operator()(&isMatch,__args);
      if (bVar1) {
        current_time = (entry->timestamp).__d.__r / 1000000000;
        Jupiter::Socket::ntop4_abi_cxx11_((uint)&ip_str);
        __tp = localtime(&current_time);
        strftime(timeStr,0x100,"%b %d %Y, %H:%M:%S",__tp);
        if (entry->flags == '\0') {
          local_1f8._M_dataplus._M_p = (pointer)0x6;
          local_1f8._M_string_length = 0x13cc4c;
          std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&types,(basic_string_view<char,_std::char_traits<char>_> *)&local_1f8
                    );
        }
        else {
          types._M_string_length = 0;
          *types._M_dataplus._M_p = '\0';
          bVar2 = entry->flags;
          if ((bVar2 & 4) != 0) {
            local_1f8._M_dataplus._M_p = (pointer)0x5;
            local_1f8._M_string_length = 0x13d3b4;
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_1f8);
            bVar2 = entry->flags;
          }
          if ((bVar2 & 2) != 0) {
            local_1f8._M_dataplus._M_p = (pointer)0x4;
            local_1f8._M_string_length = 0x13d3ba;
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_1f8);
            bVar2 = entry->flags;
          }
          if ((bVar2 & 0x40) != 0) {
            local_1f8._M_dataplus._M_p = (pointer)0x3;
            local_1f8._M_string_length = 0x13d3bf;
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&types,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_1f8);
          }
          local_1f8._M_dataplus._M_p = (pointer)0x1;
          local_1f8._M_string_length = 0x13cc51;
          std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&types,(basic_string_view<char,_std::char_traits<char>_> *)&local_1f8
                    );
        }
        pcVar4 = "in";
        if ((char)entry->flags < '\0') {
          pcVar4 = "";
        }
        string_printf_abi_cxx11_
                  (&local_1f8,
                   "ID: %lu (%sactive); Date: %s; IP: %.*s/%u; Steam: %llu; Types:%.*s Setter: %.*s"
                   ,lVar6,pcVar4,timeStr,ip_str._M_string_length,ip_str._M_dataplus._M_p,
                   (ulong)entry->prefix_length,entry->steamid,types._M_string_length,
                   types._M_dataplus._M_p,(entry->setter)._M_string_length,
                   (entry->setter)._M_dataplus._M_p);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&out,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        Jupiter::IRC::Client::sendNotice
                  (local_228,local_220,local_230,out._M_string_length,out._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&ip_str);
      }
    }
    if (out._M_string_length == 0) {
      Jupiter::IRC::Client::sendNotice(local_228,local_220,local_230,0x11,"No matches found.");
    }
    std::__cxx11::string::~string((string *)&types);
    std::__cxx11::string::~string((string *)&out);
    std::_Function_base::~_Function_base(&isMatch.super__Function_base);
  }
  return;
}

Assistant:

void ExemptionSearchIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	const auto& entries = RenX::exemptionDatabase->getEntries();
	if (!parameters.empty())
	{
		if (entries.size() == 0) {
			source->sendNotice(nick, "The exemption database is empty!"sv);
		}
		else {
			auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);

			RenX::ExemptionDatabase::Entry *entry;
			std::string_view params = command_split.second;
			std::function<bool(unsigned int)> isMatch = [&](unsigned int type_l) -> bool {
				switch (type_l)
				{
				default:
				case 0:	// ANY
					return isMatch(1) || isMatch(2) || isMatch(3) || isMatch(4);
				case 1: // ALL
					return true;
				case 2:	// IP
					return entry->ip == Jupiter::asUnsignedInt(params);
				case 3:	// STEAM
					return entry->steamid == Jupiter::asUnsignedLongLong(params);
				case 4:	// SETTER
					return jessilib::equalsi(entry->setter, params);
				case 5:	// ACTIVE
					return entry->is_active() == Jupiter::asBool(params);
				}
			};

			unsigned int type;
			std::string_view type_str = command_split.first;
			if (jessilib::equalsi(type_str, "all"sv) || type_str == "*"sv)
				type = 1;
			else if (jessilib::equalsi(type_str, "ip"sv))
				type = 2;
			else if (jessilib::equalsi(type_str, "steam"sv))
				type = 3;
			else if (jessilib::equalsi(type_str, "setter"sv))
				type = 4;
			else if (jessilib::equalsi(type_str, "active"sv))
				type = 5;
			else {
				type = 0;
				params = parameters;
			}

			std::string out;
			std::string types;
			char timeStr[256];
			for (size_t i = 0; i != entries.size(); i++)
			{
				entry = entries[i].get();
				if (isMatch(type))
				{
					time_t current_time = std::chrono::system_clock::to_time_t(entry->timestamp);
					std::string ip_str = Jupiter::Socket::ntop4(entry->ip);
					strftime(timeStr, sizeof(timeStr), "%b %d %Y, %H:%M:%S", localtime(&current_time));

					if ((entry->flags & 0xFF) == 0)
						types = " NULL;"sv;
					else
					{
						types.clear();
						if (entry->is_type_kick())
							types += " kick"sv;
						if (entry->is_type_ban())
							types += " ban"sv;
						if (entry->is_ip_exemption())
							types += " ip"sv;
						types += ";"sv;
					}

					out = string_printf("ID: %lu (%sactive); Date: %s; IP: %.*s/%u; Steam: %llu; Types:%.*s Setter: %.*s",
						i, entry->is_active() ? "" : "in", timeStr, ip_str.size(), ip_str.data(), entry->prefix_length, entry->steamid,
						types.size(), types.data(), entry->setter.size(), entry->setter.data());

					source->sendNotice(nick, out);
				}
			}
			if (out.empty())
				source->sendNotice(nick, "No matches found."sv);
		}
	}
	else
		source->sendNotice(nick, string_printf("There are a total of %u entries in the exemption database.", entries.size()));
}